

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

void int_div(IntVar *x,IntVar *y,IntVar *z)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  IntView<4> _z;
  IntView<4> _z_00;
  IntView<1> _z_01;
  IntView<1> _z_02;
  Divide<5,_1,_4> *this;
  Divide<4,_0,_4> *this_00;
  Divide<0,_1,_1> *this_01;
  Divide<1,_0,_1> *this_02;
  undefined8 extraout_RAX;
  void *unaff_R12;
  IntView<5> _x;
  IntView<4> _x_00;
  IntView<0> _x_01;
  IntView<1> _x_02;
  IntView<1> _y;
  IntView<0> _y_00;
  IntView<1> _y_01;
  IntView<0> _y_02;
  
  iVar1 = (x->min).v;
  if ((((-1 < iVar1) || ((x->max).v < 1)) && ((iVar2 = (y->min).v, -1 < iVar2 || ((y->max).v < 1))))
     && ((iVar3 = (z->min).v, -1 < iVar3 || ((z->max).v < 1)))) {
    if (iVar1 < 0) {
      bVar4 = (x->max).v < 1;
    }
    else {
      bVar4 = false;
    }
    if (iVar2 < 0) {
      bVar5 = (y->max).v < 1;
    }
    else {
      bVar5 = false;
    }
    if (iVar3 < 0) {
      bVar6 = (z->max).v < 1;
    }
    else {
      bVar6 = false;
    }
    if ((bVar4 || bVar5) || bVar6) {
      if ((bool)(bVar5 & bVar6) && !bVar4) {
        this_01 = (Divide<0,_1,_1> *)operator_new(0x50);
        _z_01.a = 1;
        _z_01.b = 0;
        _z_01.var = z;
        _x_01.a = 1;
        _x_01.b = 0;
        _x_01.var = x;
        _y_01.a = 1;
        _y_01.b = 0;
        _y_01.var = y;
        Divide<0,_1,_1>::Divide(this_01,_x_01,_y_01,_z_01);
      }
      else if ((bool)(bVar4 & bVar6) && !bVar5) {
        this_02 = (Divide<1,_0,_1> *)operator_new(0x50);
        _z_02.a = 1;
        _z_02.b = 0;
        _z_02.var = z;
        _x_02.a = 1;
        _x_02.b = 0;
        _x_02.var = x;
        _y_02.a = 1;
        _y_02.b = 0;
        _y_02.var = y;
        Divide<1,_0,_1>::Divide(this_02,_x_02,_y_02,_z_02);
      }
      else {
        if (bVar6 || !(bool)(bVar4 & bVar5)) goto LAB_001ade11;
        this = (Divide<5,_1,_4> *)operator_new(0x50);
        _z.a = 1;
        _z.b = 1;
        _z.var = z;
        _x.a = 1;
        _x.b = 1;
        _x.var = x;
        _y.a = 1;
        _y.b = 0;
        _y.var = y;
        Divide<5,_1,_4>::Divide(this,_x,_y,_z);
      }
    }
    else {
      this_00 = (Divide<4,_0,_4> *)operator_new(0x50);
      _z_00.a = 1;
      _z_00.b = 1;
      _z_00.var = z;
      _x_00.a = 1;
      _x_00.b = 1;
      _x_00.var = x;
      _y_00.a = 1;
      _y_00.b = 0;
      _y_00.var = y;
      Divide<4,_0,_4>::Divide(this_00,_x_00,_y_00,_z_00);
    }
    return;
  }
  int_div();
LAB_001ade11:
  int_div();
  operator_delete(unaff_R12);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void int_div(IntVar* x, IntVar* y, IntVar* z) {
	if ((get_sign(x) == 0) || (get_sign(y) == 0) || (get_sign(z) == 0)) {
		CHUFFED_ERROR("Cannot handle non-sign-fixed vars\n");
	}
	const bool x_flip = (get_sign(x) == -1);
	const bool y_flip = (get_sign(y) == -1);
	const bool z_flip = (get_sign(z) == -1);

	if (!x_flip && !y_flip && !z_flip) {
		// ceil(x+1 / y) = z+1
		new Divide<4, 0, 4>(IntView<>(x, 1, 1), IntView<>(y), IntView<>(z, 1, 1));
	} else if (!x_flip && y_flip && z_flip) {
		// ceil(x / -y) = -z
		new Divide<0, 1, 1>(IntView<>(x), IntView<>(y), IntView<>(z));
	} else if (x_flip && !y_flip && z_flip) {
		// ceil(-x / y) = -z
		new Divide<1, 0, 1>(IntView<>(x), IntView<>(y), IntView<>(z));
	} else if (x_flip && y_flip && !z_flip) {
		// ceil(-x+1 / -y) = z+1
		new Divide<5, 1, 4>(IntView<>(x, 1, 1), IntView<>(y), IntView<>(z, 1, 1));
	} else {
		CHUFFED_ERROR("Cannot handle this case\n");
	}
}